

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void bcd_put_digit(ppc_avr_t *bcd,uint8_t digit,int n)

{
  if ((n & 1U) == 0) {
    bcd->u8[n >> 1] = bcd->u8[n >> 1] & 0xf0 | digit;
    return;
  }
  bcd->u8[n / 2] = digit << 4 | bcd->u8[n / 2] & 0xf;
  return;
}

Assistant:

static void bcd_put_digit(ppc_avr_t *bcd, uint8_t digit, int n)
{
    if (n & 1) {
        bcd->VsrB(BCD_DIG_BYTE(n)) &= 0x0F;
        bcd->VsrB(BCD_DIG_BYTE(n)) |= (digit << 4);
    } else {
        bcd->VsrB(BCD_DIG_BYTE(n)) &= 0xF0;
        bcd->VsrB(BCD_DIG_BYTE(n)) |= digit;
    }
}